

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

void __thiscall mat_lib::matrix<double>::matrix(matrix<double> *this,string *file_name)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  element_t *peVar4;
  long lVar5;
  ostream *poVar6;
  logic_error *plVar7;
  ulong uVar8;
  size_t i;
  size_t sVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  string_type sStack_458;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  numbers;
  regex rx;
  cmatch results;
  is_any_ofF<char> local_3c8;
  string str;
  ifstream ifs;
  byte abStack_218 [200];
  undefined8 auStack_150 [36];
  
  (this->super_base_matrix<double>).format__ = fixed;
  (this->super_base_matrix<double>).fractional_digits__ = 6;
  this->rows__ = 0;
  this->columns__ = 0;
  this->elements__ = (element_t *)0x0;
  std::ifstream::ifstream(&ifs,(string *)file_name,_S_in);
  if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    poVar6 = std::operator<<((ostream *)&str,"cannot open file \"");
    poVar6 = std::operator<<(poVar6,(string *)file_name);
    poVar6 = std::operator<<(poVar6,"\"! (");
    poVar6 = std::operator<<(poVar6,"matrix");
    poVar6 = std::operator<<(poVar6,"() in ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x11e);
    std::operator<<(poVar6,")");
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::logic_error::logic_error(plVar7,(string *)&rx);
    __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  str._M_dataplus._M_p = (pointer)&str.field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&str,*(undefined8 *)((long)auStack_150 + *(long *)(_ifs + -0x18)),
             0xffffffffffffffff,0,0xffffffff);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&rx,
             "mat_lib::matrix\\[(\\d+)x(\\d)\\]\\{\\n\\s*(([-+]?\\d*\\.?\\d+([eE][-+]?\\d+)?(,\\s|\\n\\s*)?)+)+\\n\\}"
             ,0x10);
  results.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results._M_begin = (char *)0x0;
  results.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  results.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = std::
          regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
                    (str._M_dataplus._M_p,&results,&rx,0);
  if (bVar2) {
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::str
              (&sStack_458,&results,1);
    iVar3 = std::__cxx11::stoi(&sStack_458,(size_t *)0x0,10);
    this->rows__ = (long)iVar3;
    std::__cxx11::string::~string((string *)&sStack_458);
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::str
              (&sStack_458,&results,2);
    iVar3 = std::__cxx11::stoi(&sStack_458,(size_t *)0x0,10);
    this->columns__ = (long)iVar3;
    std::__cxx11::string::~string((string *)&sStack_458);
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    numbers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::str
              (&sStack_458,&results,3);
    boost::algorithm::is_any_of<char[6]>(&local_3c8,(char (*) [6])"(,|\n)");
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
              (&numbers,&sStack_458,&local_3c8,token_compress_off);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_3c8);
    std::__cxx11::string::~string((string *)&sStack_458);
    uVar8 = (long)numbers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)numbers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    sVar9 = this->rows__;
    sVar13 = this->columns__;
    if (uVar8 == sVar13 * sVar9) {
      peVar4 = (element_t *)
               operator_new__(-(ulong)(uVar8 >> 0x3d != 0) |
                              (long)numbers.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)numbers.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2);
      this->elements__ = peVar4;
      lVar5 = 0;
      for (uVar8 = 0; uVar8 < sVar9; uVar8 = uVar8 + 1) {
        lVar10 = (long)(int)lVar5 << 5;
        lVar11 = 0;
        for (uVar12 = 0; uVar12 < sVar13; uVar12 = uVar12 + 1) {
          dVar1 = std::__cxx11::stod((string *)
                                     ((long)&((numbers.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar10),(size_t *)0x0);
          sVar13 = this->columns__;
          *(double *)((long)this->elements__ + (lVar11 >> 0x1d) + sVar13 * uVar8 * 8) = dVar1;
          lVar10 = lVar10 + 0x20;
          lVar11 = lVar11 + 0x100000000;
        }
        sVar9 = this->rows__;
        lVar5 = (long)(int)lVar5 + uVar12;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&numbers);
      std::
      _Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       *)&results);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&rx);
      std::__cxx11::string::~string((string *)&str);
      std::ifstream::~ifstream(&ifs);
      return;
    }
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar7,"the file are incorrect: bad declaration of matrix");
    __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar7,"the file are incorrect: bad expresion");
  __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

matrix<T>::matrix(const string& file_name) // constructor from a file
  : rows__{0},
    columns__{0},
    elements__{nullptr}
  {
    ifstream ifs(file_name);
    if(!ifs)
    {
      ostringstream str_stream;
      str_stream<<"cannot open file \""<<file_name<<"\"! ("
        <<__func__<<"() in "<<__FILE__<<":"<<__LINE__<<")";
      throw logic_error(str_stream.str());
    }

    string str((istreambuf_iterator<char>(ifs)),
               istreambuf_iterator<char>());

    regex rx(R"(mat_lib::matrix\[(\d+)x(\d)\]\{\n\s*(([-+]?\d*\.?\d+([eE][-+]?\d+)?(,\s|\n\s*)?)+)+\n\})");
    cmatch results;
    if (not regex_match(str.c_str(),results,rx)) {
        throw logic_error("the file are incorrect: bad expresion");
    }

    rows__ = stoi(results.str(1));
    columns__ = stoi(results.str(2));
    vector<string> numbers;
    boost::split(numbers, results.str(3), boost::is_any_of("(,|\n)"));


    if (numbers.size() != rows__*columns__) {
      throw logic_error("the file are incorrect: bad declaration of matrix");
    }

    elements__ = new element_t[rows__*columns__];

    int index = 0;
    for(size_t i=0; i<rows__; i++){
      for(size_t j=0; j<columns__; j++) {
          elements__[offset__(i, j)] = stod(numbers[index]);
          index++;
      }
    }
  }